

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_CCtx_params *
ZSTD_assignParamsToCCtxParams
          (ZSTD_CCtx_params *__return_storage_ptr__,ZSTD_CCtx_params *cctxParams,
          ZSTD_parameters *params)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ZSTD_compressionParameters cParams;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  ZSTD_strategy ZVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  size_t sVar16;
  
  memcpy(__return_storage_ptr__,cctxParams,0x90);
  uVar1 = (params->cParams).minMatch;
  uVar4 = (params->cParams).windowLog;
  uVar5 = (params->cParams).chainLog;
  uVar6 = (params->cParams).hashLog;
  uVar7 = (params->cParams).searchLog;
  cParams.searchLog = uVar7;
  cParams.hashLog = uVar6;
  cParams.chainLog = uVar5;
  cParams.windowLog = uVar4;
  uVar2 = (params->cParams).targetLength;
  uVar3 = (params->cParams).strategy;
  cParams.strategy = uVar3;
  cParams.targetLength = uVar2;
  cParams.minMatch = uVar1;
  sVar16 = ZSTD_checkCParams(cParams);
  if (sVar16 == 0) {
    uVar11 = (params->cParams).windowLog;
    uVar12 = (params->cParams).chainLog;
    uVar13 = (params->cParams).hashLog;
    uVar14 = (params->cParams).searchLog;
    uVar8 = (params->cParams).minMatch;
    uVar9 = (params->cParams).targetLength;
    ZVar10 = (params->cParams).strategy;
    (__return_storage_ptr__->cParams).searchLog = (params->cParams).searchLog;
    (__return_storage_ptr__->cParams).minMatch = uVar8;
    (__return_storage_ptr__->cParams).targetLength = uVar9;
    (__return_storage_ptr__->cParams).strategy = ZVar10;
    (__return_storage_ptr__->cParams).windowLog = uVar11;
    (__return_storage_ptr__->cParams).chainLog = uVar12;
    (__return_storage_ptr__->cParams).hashLog = uVar13;
    (__return_storage_ptr__->cParams).searchLog = uVar14;
    iVar15 = (params->fParams).checksumFlag;
    (__return_storage_ptr__->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
    (__return_storage_ptr__->fParams).checksumFlag = iVar15;
    (__return_storage_ptr__->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
    __return_storage_ptr__->compressionLevel = 3;
    return __return_storage_ptr__;
  }
  __assert_fail("!ZSTD_checkCParams(params->cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2b4d,
                "ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(const ZSTD_CCtx_params *, const ZSTD_parameters *)"
               );
}

Assistant:

static ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(
        const ZSTD_CCtx_params* cctxParams, const ZSTD_parameters* params)
{
    ZSTD_CCtx_params ret = *cctxParams;
    assert(!ZSTD_checkCParams(params->cParams));
    ret.cParams = params->cParams;
    ret.fParams = params->fParams;
    ret.compressionLevel = ZSTD_CLEVEL_DEFAULT;   /* should not matter, as all cParams are presumed properly defined */
    return ret;
}